

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  int local_24;
  int rc;
  sqlite3_value *pValue_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  switch(pValue->type) {
  case '\x01':
    local_24 = sqlite3_bind_int64(pStmt,i,(pValue->u).i);
    break;
  case '\x02':
    local_24 = sqlite3_bind_double(pStmt,i,pValue->r);
    break;
  case '\x03':
    local_24 = bindText(pStmt,i,pValue->z,pValue->n,(_func_void_void_ptr *)0xffffffffffffffff,
                        pValue->enc);
    break;
  case '\x04':
    if ((pValue->flags & 0x4000) == 0) {
      local_24 = sqlite3_bind_blob(pStmt,i,pValue->z,pValue->n,
                                   (_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      local_24 = sqlite3_bind_zeroblob(pStmt,i,(pValue->u).nZero);
    }
    break;
  default:
    local_24 = sqlite3_bind_null(pStmt,i);
  }
  return local_24;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( pValue->type ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      rc = sqlite3_bind_double(pStmt, i, pValue->r);
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}